

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageview.cpp
# Opt level: O1

void __thiscall QtMWidgets::PageViewPrivate::movePageRight(PageViewPrivate *this,int delta)

{
  long lVar1;
  PageControl *this_00;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  QRect local_20;
  
  if (this->pagesPrepared == false) {
    lVar1 = *(long *)(this->viewport + 0x20);
    local_20.x2 = *(int *)(lVar1 + 0x1c) - *(int *)(lVar1 + 0x14);
    local_20.y2 = *(int *)(lVar1 + 0x20) - *(int *)(lVar1 + 0x18);
    local_20.x1 = 0;
    local_20.y1 = 0;
    preparePages(this,&local_20);
  }
  iVar2 = PageControl::currentIndex(this->control);
  if (-1 < this->pagesOffset && iVar2 == 0) {
    return;
  }
  iVar3 = this->pagesOffset + delta;
  iVar2 = -iVar3;
  if (0 < iVar3) {
    iVar2 = iVar3;
  }
  this->pagesOffset = iVar3;
  lVar1 = *(long *)(this->viewport + 0x20);
  uVar4._0_4_ = *(int *)(lVar1 + 0x1c) - *(int *)(lVar1 + 0x14);
  if (iVar2 < (int)uVar4 + 1) {
    movePages(this);
    return;
  }
  uVar4._4_4_ = *(int *)(lVar1 + 0x20) - *(int *)(lVar1 + 0x18);
  local_20.x1 = 0;
  local_20.y1 = 0;
  local_20._8_8_ = uVar4;
  invalidatePages(this,&local_20);
  this_00 = this->control;
  iVar2 = PageControl::currentIndex(this_00);
  PageControl::setCurrentIndex(this_00,iVar2 + -1);
  return;
}

Assistant:

void
PageViewPrivate::movePageRight( int delta )
{
	if( !pagesPrepared )
		preparePages( viewport->rect() );

	if( control->currentIndex() != 0 || pagesOffset < 0 )
	{
		pagesOffset += delta;

		if( qAbs( pagesOffset ) < viewport->width() )
			movePages();
		else
		{
			invalidatePages( viewport->rect() );

			control->setCurrentIndex( control->currentIndex() - 1 );
		}
	}
}